

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
::operator()(optimize_functor<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,quadratic_cost_type<float> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  context *this_00;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  local_context *ctx;
  quadratic_cost_type<float> *pqVar11;
  int push;
  long loop;
  float theta;
  float fVar12;
  float fVar13;
  float __y;
  float objective_amplifier;
  float fVar14;
  double dVar15;
  undefined1 auVar17 [64];
  double dVar16;
  undefined1 extraout_var [60];
  undefined1 auVar18 [64];
  undefined1 in_ZMM3 [64];
  float local_188;
  bit_array x;
  quadratic_cost_type<float> norm_costs;
  compute_order compute;
  solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  slv;
  undefined1 extraout_var_00 [60];
  
  pqVar11 = original_costs;
  bit_array_impl::bit_array_impl(&x.super_bit_array_impl,variables);
  this_00 = this->m_ctx;
  ctx = &this->m_local_ctx;
  normalize_costs<float,baryonyx::itm::quadratic_cost_type<float>>
            (&norm_costs,(itm *)this_00,(context *)original_costs,(quadratic_cost_type<float> *)ctx,
             (random_engine *)(ulong)(uint)variables,(int)pqVar11);
  dVar15 = (this_00->parameters).kappa_step;
  dVar1 = (this_00->parameters).delta;
  dVar16 = (this_00->parameters).kappa_max;
  dVar2 = (this_00->parameters).alpha;
  theta = (float)(this_00->parameters).theta;
  if (0.0 <= dVar1) {
    local_188 = (float)dVar1;
  }
  else {
    local_188 = compute_delta<float,baryonyx::itm::quadratic_cost_type<float>>
                          (this->m_ctx,&norm_costs,theta,variables);
  }
  dVar1 = (this_00->parameters).w;
  dVar3 = (this_00->parameters).pushing_k_factor;
  dVar4 = (this_00->parameters).pushing_objective_amplifier;
  solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  ::solver_equalities_101coeff
            (&slv,&ctx->rng,
             (int)(((long)(constraints->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(constraints->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28),variables,&norm_costs,
             constraints);
  compute_order::compute_order(&compute,(this_00->parameters).order,variables);
  fVar12 = (float)dVar15;
  fVar13 = (float)dVar16;
  __y = (float)dVar2;
  objective_amplifier = (float)dVar4;
  do {
    bVar6 = false;
LAB_00274eac:
    if (((stop_task->_M_base)._M_i & 1U) != 0) {
      compute_order::~compute_order(&compute);
      solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
      ::~solver_equalities_101coeff(&slv);
      quadratic_cost_type<float>::~quadratic_cost_type(&norm_costs);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                (&x.super_bit_array_impl.m_data);
      return;
    }
    this->m_call_number = this->m_call_number + 1;
    dVar15 = best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
             ::reinit(best_recorder,ctx,bVar6,(this_00->parameters).kappa_min,
                      (this_00->parameters).kappa_max,&x);
    compute_order::
    init<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
              (&compute,&slv,&x);
    auVar17 = ZEXT1664(CONCAT124(in_ZMM3._4_12_,(float)dVar15));
    iVar10 = 0x7fffffff;
    for (loop = 0; (((stop_task->_M_base)._M_i & 1U) == 0 && (loop != (this_00->parameters).limit));
        loop = loop + 1) {
      fVar14 = auVar17._0_4_;
      iVar7 = compute_order::
              run<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>
                        (&compute,&slv,&x,&ctx->rng,fVar14,local_188,theta);
      if (iVar7 == 0) {
        dVar16 = quadratic_cost_type<float>::results(original_costs,&x,cost_constant);
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
        ::try_update(best_recorder,ctx,&x,dVar16,loop);
        bVar6 = true;
        goto LAB_00275007;
      }
      if (iVar7 <= iVar10) {
        iVar10 = iVar7;
      }
      if ((long)dVar1 < loop) {
        auVar17._0_4_ = powf((float)iVar7 / (float)slv.m,__y);
        auVar17._4_60_ = extraout_var;
        auVar5 = vfmadd231ss_fma(ZEXT416((uint)fVar14),auVar17._0_16_,ZEXT416((uint)fVar12));
        auVar17 = ZEXT1664(auVar5);
      }
      else {
        auVar17 = ZEXT464((uint)fVar14);
      }
      if (fVar13 < auVar17._0_4_) break;
    }
    if (iVar10 < 1) {
      bVar6 = false;
LAB_00275007:
      iVar10 = 0;
      for (iVar7 = 0;
          (((stop_task->_M_base)._M_i & 1U) == 0 && (iVar7 < (this_00->parameters).pushes_limit));
          iVar7 = iVar7 + 1) {
        in_ZMM3 = ZEXT464((uint)objective_amplifier);
        iVar8 = compute_order::
                push_and_run<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>
                          (&compute,&slv,&x,&ctx->rng,(float)dVar3,local_188,theta,
                           objective_amplifier);
        if (iVar8 == 0) {
          dVar16 = quadratic_cost_type<float>::results(original_costs,&x,cost_constant);
          best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
          ::try_update(best_recorder,ctx,&x,dVar16,
                       (long)~((this_00->parameters).pushing_iteration_limit * iVar7));
          bVar6 = true;
        }
        auVar17 = ZEXT464((uint)(float)dVar15);
        iVar8 = 1;
        while( true ) {
          if ((((stop_task->_M_base)._M_i & 1U) != 0) ||
             ((this_00->parameters).pushing_iteration_limit <= iVar8 + -1)) goto LAB_00275193;
          fVar14 = auVar17._0_4_;
          iVar9 = compute_order::
                  run<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,float>
                            (&compute,&slv,&x,&ctx->rng,fVar14,local_188,theta);
          if (iVar9 == 0) break;
          if ((double)(iVar8 + -1) <= (this_00->parameters).w) {
            auVar17 = ZEXT464((uint)fVar14);
          }
          else {
            auVar18._0_4_ = powf((float)iVar9 / (float)slv.m,__y);
            auVar18._4_60_ = extraout_var_00;
            auVar5 = vfmadd231ss_fma(ZEXT416((uint)fVar14),auVar18._0_16_,ZEXT416((uint)fVar12));
            auVar17 = ZEXT1664(auVar5);
          }
          if (fVar13 < auVar17._0_4_) goto LAB_00275193;
          iVar8 = iVar8 + 1;
        }
        dVar16 = quadratic_cost_type<float>::results(original_costs,&x,cost_constant);
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
        ::try_update(best_recorder,ctx,&x,dVar16,
                     (long)((this_00->parameters).pushing_iteration_limit * iVar10 - iVar8));
        bVar6 = true;
LAB_00275193:
        iVar10 = iVar10 + -1;
      }
      goto LAB_00274eac;
    }
    best_solution_recorder<baryonyx::itm::quadratic_cost_type<float>,_float,_baryonyx::itm::maximize_tag>
    ::try_advance(best_recorder,ctx,&x,iVar10,(this_00->parameters).limit);
  } while( true );
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }